

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void * xmalloc(size_t size)

{
  void *pvVar1;
  
  if (size == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = malloc(size);
    if (pvVar1 == (void *)0x0) {
      fprintf(_stderr,"%s\n","not enough memory");
      abort();
    }
  }
  return pvVar1;
}

Assistant:

static inline void* xmalloc(size_t size) {
    if (size == 0)
        return NULL;
    void* ptr = malloc(size);
    if (!ptr)
        die("not enough memory");
    return ptr;
}